

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O0

void Jupiter::Plugin::free(void *__ptr)

{
  void *pvVar1;
  reference puVar2;
  pointer pdVar3;
  code *pcVar4;
  func_type unload_func;
  const_iterator local_58;
  unique_ptr<dlib,_std::default_delete<dlib>_> local_50;
  unique_ptr<dlib,_std::default_delete<dlib>_> dPlug;
  __normal_iterator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_*,_std::vector<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>_>
  local_40;
  __normal_iterator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_*,_std::vector<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>_>
  dPlugItr;
  __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
  local_30;
  __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
  local_28;
  const_iterator local_20;
  void *local_18;
  size_t index_local;
  
  local_18 = __ptr;
  pvVar1 = (void *)std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::size
                             (&g_plugins);
  if (__ptr < pvVar1) {
    local_30._M_current =
         (Plugin **)
         std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::begin(&g_plugins);
    local_28 = __gnu_cxx::
               __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
               ::operator+(&local_30,(difference_type)local_18);
    __gnu_cxx::
    __normal_iterator<Jupiter::Plugin*const*,std::vector<Jupiter::Plugin*,std::allocator<Jupiter::Plugin*>>>
    ::__normal_iterator<Jupiter::Plugin**>
              ((__normal_iterator<Jupiter::Plugin*const*,std::vector<Jupiter::Plugin*,std::allocator<Jupiter::Plugin*>>>
                *)&local_20,&local_28);
    dPlugItr._M_current =
         (unique_ptr<dlib,_std::default_delete<dlib>_> *)
         std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::erase
                   (&g_plugins,local_20);
    dPlug._M_t.super___uniq_ptr_impl<dlib,_std::default_delete<dlib>_>._M_t.
    super__Tuple_impl<0UL,_dlib_*,_std::default_delete<dlib>_>.super__Head_base<0UL,_dlib_*,_false>.
    _M_head_impl = (__uniq_ptr_data<dlib,_std::default_delete<dlib>,_true,_true>)
                   std::
                   vector<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>
                   ::begin(&g_libList);
    local_40 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_*,_std::vector<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>_>
               ::operator+((__normal_iterator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_*,_std::vector<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>_>
                            *)&dPlug,(difference_type)local_18);
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_*,_std::vector<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>_>
             ::operator*(&local_40);
    std::unique_ptr<dlib,_std::default_delete<dlib>_>::unique_ptr(&local_50,puVar2);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dlib,std::default_delete<dlib>>const*,std::vector<std::unique_ptr<dlib,std::default_delete<dlib>>,std::allocator<std::unique_ptr<dlib,std::default_delete<dlib>>>>>
    ::__normal_iterator<std::unique_ptr<dlib,std::default_delete<dlib>>*>
              ((__normal_iterator<std::unique_ptr<dlib,std::default_delete<dlib>>const*,std::vector<std::unique_ptr<dlib,std::default_delete<dlib>>,std::allocator<std::unique_ptr<dlib,std::default_delete<dlib>>>>>
                *)&local_58,&local_40);
    std::
    vector<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>
    ::erase(&g_libList,local_58);
    pdVar3 = std::unique_ptr<dlib,_std::default_delete<dlib>_>::operator->(&local_50);
    pcVar4 = (code *)dlsym(pdVar3->lib,"unload");
    if (pcVar4 != (code *)0x0) {
      (*pcVar4)();
    }
    index_local._7_1_ = 1;
    std::unique_ptr<dlib,_std::default_delete<dlib>_>::~unique_ptr(&local_50);
  }
  return;
}

Assistant:

bool Jupiter::Plugin::free(size_t index) {
	if (index < g_plugins.size()) {
		// Do not free() the plugin; plugin gets free'd either by FreeLibrary() during static memory deallocation or unload.
		g_plugins.erase(g_plugins.begin() + index);
		auto dPlugItr = g_libList.begin() + index;
		std::unique_ptr<dlib> dPlug = std::move(*dPlugItr);
		g_libList.erase(dPlugItr);

		typedef void(*func_type)(void);
#if defined _WIN32
		func_type unload_func = (func_type)GetProcAddress(dPlug->lib, "unload");
#else // _WIN32
		func_type unload_func = (func_type)dlsym(dPlug->lib, "unload");
#endif // _WIN32
		if (unload_func != nullptr) {
			unload_func();
		}
		return true;
	}
	return false;
}